

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VXPrintf(StrAccum *pAccum,int useExtended,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  uint *puVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  __va_list_tag *p_Var11;
  __va_list_tag *p_Var12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  int *local_360;
  long *local_348;
  long *local_330;
  bool local_31a;
  long *local_318;
  undefined8 *local_300;
  int *local_2e8;
  undefined8 *local_2d0;
  double *local_2b0;
  uint *local_288;
  ulong *local_270;
  ulong *local_258;
  int *local_240;
  ulong *local_228;
  ulong *local_210;
  int *local_1e8;
  int *local_1d0;
  int nspace_1;
  int nspace;
  SrcList_item *pItem;
  int k_1;
  SrcList *pSrc;
  Token *pToken;
  char *escarg;
  char q;
  char ch;
  int needQuote;
  int isnull;
  int n;
  int k;
  int j;
  int i_1;
  int nPad;
  int i;
  longdouble scale;
  char *pcStack_128;
  char x_1;
  char *pre;
  int base;
  char *cset;
  ulong uStack_108;
  int x;
  i64 v;
  undefined1 local_f8 [4];
  int amt;
  char buf [70];
  etByte flag_rtz;
  etByte flag_dp;
  double rounder;
  int local_a0;
  int nsd;
  int e2;
  int exp;
  char *zExtra;
  __va_list_tag *p_Stack_88;
  int nOut;
  char *zOut;
  et_info *infop;
  longdouble realvalue;
  ulong local_60;
  sqlite_uint64 longvalue;
  bool local_50;
  char local_4f;
  char local_4e;
  byte local_4d;
  byte local_4c;
  char prefix;
  etByte xtype;
  etByte done;
  etByte flag_longlong;
  etByte flag_long;
  etByte flag_zeropad;
  etByte flag_altform2;
  etByte flag_alternateform;
  etByte flag_blanksign;
  etByte flag_plussign;
  etByte flag_leftjustify;
  int width;
  int idx;
  int length;
  int precision;
  char *bufpt;
  __va_list_tag *p_Stack_28;
  int c;
  __va_list_tag *ap_local;
  char *fmt_local;
  StrAccum *pSStack_10;
  int useExtended_local;
  StrAccum *pAccum_local;
  
  longvalue._6_1_ = '\0';
  _length = (char *)0x0;
  p_Stack_28 = ap;
  fmt_local._4_4_ = useExtended;
  pSStack_10 = pAccum;
  for (ap_local = (__va_list_tag *)fmt; p_Var12 = ap_local, cVar7 = (char)ap_local->gp_offset,
      cVar7 != '\0'; ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 1)) {
    if (cVar7 != '%') {
      _length = (char *)ap_local;
      v._4_4_ = 1;
      while( true ) {
        p_Var11 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
        bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 1);
        ap_local = p_Var11;
        if (bufpt._4_4_ == 0x25 || bufpt._4_4_ == 0) break;
        v._4_4_ = v._4_4_ + 1;
      }
      sqlite3StrAccumAppend(pSStack_10,(char *)p_Var12,v._4_4_);
      if (bufpt._4_4_ == 0) {
        return;
      }
    }
    p_Var12 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
    bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 1);
    if (bufpt._4_4_ == 0) {
      ap_local = p_Var12;
      sqlite3StrAccumAppend(pSStack_10,"%",1);
      return;
    }
    local_4e = '\0';
    local_4d = 0;
    local_4c = 0;
    prefix = '\0';
    xtype = '\0';
    done = '\0';
    longvalue._7_1_ = 0;
    if (bufpt._4_4_ - 0x20U < 0x10 || bufpt._4_4_ == 0x30) {
      ap_local = p_Var12;
      (*(code *)(&DAT_001ad838 + *(int *)(&DAT_001ad838 + (ulong)(bufpt._4_4_ - 0x20U) * 4)))();
      return;
    }
    longvalue._7_1_ = 1;
    _flag_longlong = 0;
    if (bufpt._4_4_ == 0x2a) {
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_1d0 = (int *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_1d0 = (int *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_1d0 + 2;
      }
      _flag_longlong = *local_1d0;
      done = _flag_longlong < 0;
      if ((bool)done) {
        _flag_longlong = -_flag_longlong;
      }
      bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 2);
      ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 2);
    }
    else {
      while (ap_local = p_Var12, 0x2f < bufpt._4_4_ && bufpt._4_4_ < 0x3a) {
        _flag_longlong = _flag_longlong * 10 + bufpt._4_4_ + -0x30;
        p_Var12 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
        bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 1);
      }
    }
    if (bufpt._4_4_ == 0x2e) {
      idx = 0;
      bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 1);
      p_Var12 = ap_local;
      if (bufpt._4_4_ == 0x2a) {
        uVar9 = p_Stack_28->gp_offset;
        if (uVar9 < 0x29) {
          local_1e8 = (int *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
          p_Stack_28->gp_offset = uVar9 + 8;
        }
        else {
          local_1e8 = (int *)p_Stack_28->overflow_arg_area;
          p_Stack_28->overflow_arg_area = local_1e8 + 2;
        }
        idx = *local_1e8;
        if (idx < 0) {
          idx = -idx;
        }
        bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 2);
        ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 2);
      }
      else {
        while (ap_local = (__va_list_tag *)((long)&p_Var12->gp_offset + 1),
              0x2f < bufpt._4_4_ && bufpt._4_4_ < 0x3a) {
          idx = idx * 10 + bufpt._4_4_ + -0x30;
          bufpt._4_4_ = (int)*(char *)((long)&p_Var12->gp_offset + 2);
          p_Var12 = ap_local;
        }
      }
    }
    else {
      idx = -1;
    }
    if (bufpt._4_4_ == 0x6c) {
      local_4f = '\x01';
      bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 1);
      local_50 = bufpt._4_4_ == 0x6c;
      p_Var12 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
      if (local_50) {
        bufpt._4_4_ = (int)*(char *)((long)&ap_local->gp_offset + 2);
        p_Var12 = (__va_list_tag *)((long)&ap_local->gp_offset + 2);
      }
    }
    else {
      local_50 = false;
      local_4f = '\0';
      p_Var12 = ap_local;
    }
    ap_local = p_Var12;
    zOut = "d\n\x01\x01";
    longvalue._6_1_ = '\0';
    for (_flag_alternateform = 0; _flag_alternateform < 0x17;
        _flag_alternateform = _flag_alternateform + 1) {
      if (bufpt._4_4_ == fmtinfo[_flag_alternateform].fmttype) {
        lVar13 = (long)_flag_alternateform;
        zOut = &fmtinfo[lVar13].fmttype;
        if ((fmt_local._4_4_ == 0) && ((fmtinfo[lVar13].flags & 2) != 0)) {
          return;
        }
        longvalue._6_1_ = fmtinfo[lVar13].type;
        break;
      }
    }
    _e2 = (__va_list_tag *)0x0;
    switch(longvalue._6_1_) {
    case '\x02':
    case '\x03':
    case '\x04':
      uVar9 = p_Stack_28->fp_offset;
      if (uVar9 < 0xa1) {
        local_2b0 = (double *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->fp_offset = uVar9 + 0x10;
      }
      else {
        local_2b0 = (double *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_2b0 + 1;
      }
      _infop = (longdouble)*local_2b0;
      if (idx < 0) {
        idx = 6;
      }
      if ((longdouble)0 <= _infop) {
        longvalue._5_1_ = '\0';
      }
      else {
        _infop = -_infop;
        longvalue._5_1_ = '-';
      }
      if ((longvalue._6_1_ == '\x04') && (0 < idx)) {
        idx = idx + -1;
      }
      stack0xffffffffffffff50 = 0.5;
      for (_flag_alternateform = idx; 0 < _flag_alternateform;
          _flag_alternateform = _flag_alternateform + -1) {
        register0x00001200 = stack0xffffffffffffff50 * 0.1;
      }
      if (longvalue._6_1_ == '\x02') {
        _infop = _infop + (longdouble)stack0xffffffffffffff50;
      }
      nsd = 0;
      iVar8 = sqlite3IsNaN((double)_infop);
      if (iVar8 == 0) {
        if ((longdouble)0 < _infop) {
          for (_nPad = (longdouble)1; (longdouble)1e+100 * _nPad <= _infop && nsd < 0x15f;
              _nPad = (longdouble)1e+100 * _nPad) {
            nsd = nsd + 100;
          }
          for (; (longdouble)1e+64 * _nPad <= _infop && nsd < 0x15f;
              _nPad = (longdouble)1e+64 * _nPad) {
            nsd = nsd + 0x40;
          }
          for (; (longdouble)1e+08 * _nPad <= _infop && nsd < 0x15f;
              _nPad = (longdouble)1e+08 * _nPad) {
            nsd = nsd + 8;
          }
          for (; (longdouble)10.0 * _nPad <= _infop && nsd < 0x15f; _nPad = (longdouble)10.0 * _nPad
              ) {
            nsd = nsd + 1;
          }
          for (_infop = _infop / _nPad; _infop < (longdouble)1e-08;
              _infop = (longdouble)1e+08 * _infop) {
            nsd = nsd + -8;
          }
          for (; _infop < (longdouble)1; _infop = (longdouble)10.0 * _infop) {
            nsd = nsd + -1;
          }
          if (0x15e < nsd) {
            if (longvalue._5_1_ == '-') {
              _length = "-Inf";
            }
            else if (longvalue._5_1_ == '+') {
              _length = "+Inf";
            }
            else {
              _length = "Inf";
            }
            width = sqlite3Strlen30(_length);
            break;
          }
        }
        _length = local_f8;
        if ((longvalue._6_1_ != '\x02') &&
           (_infop = _infop + (longdouble)stack0xffffffffffffff50, (longdouble)10.0 <= _infop)) {
          _infop = (longdouble)0.1 * _infop;
          nsd = nsd + 1;
        }
        if (longvalue._6_1_ == '\x04') {
          buf[0x3e] = (local_4c != 0 ^ 0xffU) & 1;
          if ((nsd < -4) || (idx < nsd)) {
            longvalue._6_1_ = '\x03';
          }
          else {
            idx = idx - nsd;
            longvalue._6_1_ = '\x02';
          }
        }
        else {
          buf[0x3e] = local_4d;
        }
        if (longvalue._6_1_ == '\x03') {
          local_a0 = 0;
        }
        else {
          local_a0 = nsd;
        }
        if ((0x37 < local_a0 + idx + _flag_longlong) &&
           (_e2 = (__va_list_tag *)sqlite3Malloc(local_a0 + idx + _flag_longlong + 0xf),
           _length = (char *)_e2, _e2 == (__va_list_tag *)0x0)) {
          pSStack_10->mallocFailed = '\x01';
          return;
        }
        p_Stack_88 = (__va_list_tag *)_length;
        rounder._4_4_ = (uint)local_4d * 10 + 0x10;
        buf[0x3f] = 0 < idx | local_4c | local_4d;
        if (longvalue._5_1_ != '\0') {
          puVar6 = &((__va_list_tag *)_length)->gp_offset;
          _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
          *(char *)puVar6 = longvalue._5_1_;
        }
        if (local_a0 < 0) {
          puVar6 = &((__va_list_tag *)_length)->gp_offset;
          _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
          *(char *)puVar6 = '0';
        }
        else {
          for (; -1 < local_a0; local_a0 = local_a0 + -1) {
            cVar7 = et_getdigit((longdouble *)&infop,(int *)((long)&rounder + 4));
            puVar6 = &((__va_list_tag *)_length)->gp_offset;
            _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
            *(char *)puVar6 = cVar7;
          }
        }
        if (buf[0x3f] != '\0') {
          puVar6 = &((__va_list_tag *)_length)->gp_offset;
          _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
          *(char *)puVar6 = '.';
        }
        while (local_a0 = local_a0 + 1, local_a0 < 0) {
          puVar6 = &((__va_list_tag *)_length)->gp_offset;
          _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
          *(char *)puVar6 = '0';
          idx = idx + -1;
        }
        while (iVar8 = idx + -1, 0 < idx) {
          idx = iVar8;
          cVar7 = et_getdigit((longdouble *)&infop,(int *)((long)&rounder + 4));
          puVar6 = &((__va_list_tag *)_length)->gp_offset;
          _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
          *(char *)puVar6 = cVar7;
        }
        idx = iVar8;
        if ((buf[0x3e] != '\0') && (buf[0x3f] != '\0')) {
          while (*(char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7) ==
                 '0') {
            p_Var12 = (__va_list_tag *)((long)_length + -0x18);
            _length = (char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7)
            ;
            *(undefined1 *)((long)&p_Var12->reg_save_area + 7) = 0;
          }
          if (*(char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7) == '.'
             ) {
            if (local_4d == 0) {
              p_Var12 = (__va_list_tag *)((long)_length + -0x18);
              _length = (char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area +
                                7);
              *(undefined1 *)((long)&p_Var12->reg_save_area + 7) = 0;
            }
            else {
              puVar6 = &((__va_list_tag *)_length)->gp_offset;
              _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
              *(char *)puVar6 = '0';
            }
          }
        }
        if (longvalue._6_1_ == '\x03') {
          puVar6 = &((__va_list_tag *)_length)->gp_offset;
          _length = (char *)((long)&((__va_list_tag *)_length)->gp_offset + 1);
          *(char *)puVar6 = "0123456789ABCDEF0123456789abcdef"[(byte)zOut[4]];
          if (nsd < 0) {
            pcVar1 = _length + 1;
            *_length = '-';
            _length = pcVar1;
            nsd = -nsd;
          }
          else {
            pcVar1 = _length + 1;
            *_length = '+';
            _length = pcVar1;
          }
          if (99 < nsd) {
            pcVar1 = _length + 1;
            *_length = (char)(nsd / 100) + '0';
            _length = pcVar1;
            nsd = nsd % 100;
          }
          pcVar1 = _length + 1;
          *_length = (char)(nsd / 10) + '0';
          _length = pcVar1;
          p_Var12 = (__va_list_tag *)(_length + 1);
          *_length = (char)(nsd % 10) + '0';
          _length = (char *)p_Var12;
        }
        *(char *)&((__va_list_tag *)_length)->gp_offset = '\0';
        width = (int)_length - (int)p_Stack_88;
        _length = (char *)p_Stack_88;
        if (((local_4e != '\0') && (done == '\0')) && (width < _flag_longlong)) {
          j = _flag_longlong - width;
          for (i_1 = _flag_longlong; j <= i_1; i_1 = i_1 + -1) {
            *(char *)((long)&p_Stack_88->gp_offset + (long)i_1) =
                 *(char *)((long)&p_Stack_88->gp_offset + (long)(i_1 - j));
          }
          i_1 = (uint)(longvalue._5_1_ != '\0');
          while (j != 0) {
            *(char *)((long)&p_Stack_88->gp_offset + (long)i_1) = '0';
            j = j + -1;
            i_1 = i_1 + 1;
          }
          width = _flag_longlong;
        }
      }
      else {
        _length = "NaN";
        width = 3;
      }
      break;
    case '\x05':
      iVar8 = pSStack_10->nChar;
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_2d0 = (undefined8 *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_2d0 = (undefined8 *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_2d0 + 1;
      }
      *(int *)*local_2d0 = iVar8;
      _flag_longlong = 0;
      width = 0;
      break;
    case '\x06':
    case '\a':
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_300 = (undefined8 *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_300 = (undefined8 *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_300 + 1;
      }
      _length = (char *)*local_300;
      if ((__va_list_tag *)_length == (__va_list_tag *)0x0) {
        _length = "";
      }
      else if (longvalue._6_1_ == '\a') {
        _e2 = (__va_list_tag *)_length;
      }
      if (idx < 0) {
        width = sqlite3Strlen30(_length);
      }
      else {
        width = 0;
        while( true ) {
          bVar14 = false;
          if (width < idx) {
            bVar14 = *(char *)((long)&((__va_list_tag *)_length)->gp_offset + (long)width) != '\0';
          }
          if (!bVar14) break;
          width = width + 1;
        }
      }
      break;
    case '\b':
      local_f8[0] = 0x25;
      _length = local_f8;
      width = 1;
      break;
    case '\t':
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_2e8 = (int *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_2e8 = (int *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_2e8 + 2;
      }
      bufpt._4_4_ = *local_2e8;
      local_f8[0] = (undefined1)bufpt._4_4_;
      if (idx < 0) {
        width = 1;
      }
      else {
        for (_flag_alternateform = 1; _flag_alternateform < idx;
            _flag_alternateform = _flag_alternateform + 1) {
          local_f8[_flag_alternateform] = (char)bufpt._4_4_;
        }
        width = idx;
      }
      _length = local_f8;
      break;
    case '\n':
    case '\v':
    case '\x0f':
      cVar7 = '\'';
      if (longvalue._6_1_ == '\x0f') {
        cVar7 = '\"';
      }
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_318 = (long *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_318 = (long *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_318 + 1;
      }
      pToken = (Token *)*local_318;
      bVar14 = pToken == (Token *)0x0;
      if ((bVar14) && (pToken = (Token *)"(NULL)", longvalue._6_1_ == '\v')) {
        pToken = (Token *)0x1b5122;
      }
      isnull = idx;
      needQuote = 0;
      k = 0;
      while( true ) {
        iVar8 = k;
        bVar15 = false;
        if (isnull != 0) {
          escarg._7_1_ = *(char *)((long)&pToken->z + (long)k);
          bVar15 = escarg._7_1_ != '\0';
        }
        if (!bVar15) break;
        if (escarg._7_1_ == cVar7) {
          needQuote = needQuote + 1;
        }
        k = k + 1;
        isnull = isnull + -1;
      }
      local_31a = !bVar14 && longvalue._6_1_ == '\v';
      uVar9 = (uint)local_31a;
      iVar10 = k + 1 + uVar9 * 2 + needQuote;
      if (iVar10 < 0x47) {
        _length = local_f8;
      }
      else {
        _e2 = (__va_list_tag *)sqlite3Malloc(iVar10);
        _length = (char *)_e2;
        if (_e2 == (__va_list_tag *)0x0) {
          pSStack_10->mallocFailed = '\x01';
          return;
        }
      }
      if (uVar9 != 0) {
        *(char *)&((__va_list_tag *)_length)->gp_offset = cVar7;
      }
      n = (int)(uVar9 != 0);
      for (k = 0; k < iVar8; k = k + 1) {
        escarg._7_1_ = *(char *)((long)&pToken->z + (long)k);
        *(char *)((long)&((__va_list_tag *)_length)->gp_offset + (long)n) = escarg._7_1_;
        iVar10 = n + 1;
        if (escarg._7_1_ == cVar7) {
          *(char *)((long)&((__va_list_tag *)_length)->gp_offset + (long)(n + 1)) = escarg._7_1_;
          iVar10 = n + 2;
        }
        n = iVar10;
      }
      if (uVar9 != 0) {
        *(char *)((long)&((__va_list_tag *)_length)->gp_offset + (long)n) = cVar7;
        n = n + 1;
      }
      *(char *)((long)&((__va_list_tag *)_length)->gp_offset + (long)n) = '\0';
      width = n;
      break;
    case '\f':
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_330 = (long *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_330 = (long *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_330 + 1;
      }
      puVar4 = (undefined8 *)*local_330;
      if (puVar4 != (undefined8 *)0x0) {
        sqlite3StrAccumAppend(pSStack_10,(char *)*puVar4,*(int *)(puVar4 + 1));
      }
      _flag_longlong = 0;
      width = 0;
      break;
    case '\r':
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_348 = (long *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_348 = (long *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_348 + 1;
      }
      lVar13 = *local_348;
      uVar9 = p_Stack_28->gp_offset;
      if (uVar9 < 0x29) {
        local_360 = (int *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
        p_Stack_28->gp_offset = uVar9 + 8;
      }
      else {
        local_360 = (int *)p_Stack_28->overflow_arg_area;
        p_Stack_28->overflow_arg_area = local_360 + 2;
      }
      lVar13 = lVar13 + 8 + (long)*local_360 * 0x68;
      if (*(long *)(lVar13 + 8) != 0) {
        sqlite3StrAccumAppend(pSStack_10,*(char **)(lVar13 + 8),-1);
        sqlite3StrAccumAppend(pSStack_10,".",1);
      }
      sqlite3StrAccumAppend(pSStack_10,*(char **)(lVar13 + 0x10),-1);
      _flag_longlong = 0;
      width = 0;
      break;
    case '\x0e':
      local_50 = true;
      local_4f = '\x01';
    case '\x01':
    case '\x10':
      if ((zOut[2] & 1U) == 0) {
        if (local_50 == false) {
          if (local_4f == '\0') {
            uVar9 = p_Stack_28->gp_offset;
            if (uVar9 < 0x29) {
              local_288 = (uint *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
              p_Stack_28->gp_offset = uVar9 + 8;
            }
            else {
              local_288 = (uint *)p_Stack_28->overflow_arg_area;
              p_Stack_28->overflow_arg_area = local_288 + 2;
            }
            local_60 = (ulong)*local_288;
          }
          else {
            uVar9 = p_Stack_28->gp_offset;
            if (uVar9 < 0x29) {
              local_270 = (ulong *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
              p_Stack_28->gp_offset = uVar9 + 8;
            }
            else {
              local_270 = (ulong *)p_Stack_28->overflow_arg_area;
              p_Stack_28->overflow_arg_area = local_270 + 1;
            }
            local_60 = *local_270;
          }
        }
        else {
          uVar9 = p_Stack_28->gp_offset;
          if (uVar9 < 0x29) {
            local_258 = (ulong *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
            p_Stack_28->gp_offset = uVar9 + 8;
          }
          else {
            local_258 = (ulong *)p_Stack_28->overflow_arg_area;
            p_Stack_28->overflow_arg_area = local_258 + 1;
          }
          local_60 = *local_258;
        }
        longvalue._5_1_ = '\0';
      }
      else {
        if (local_50 == false) {
          if (local_4f == '\0') {
            uVar9 = p_Stack_28->gp_offset;
            if (uVar9 < 0x29) {
              local_240 = (int *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
              p_Stack_28->gp_offset = uVar9 + 8;
            }
            else {
              local_240 = (int *)p_Stack_28->overflow_arg_area;
              p_Stack_28->overflow_arg_area = local_240 + 2;
            }
            uStack_108 = (ulong)*local_240;
          }
          else {
            uVar9 = p_Stack_28->gp_offset;
            if (uVar9 < 0x29) {
              local_228 = (ulong *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
              p_Stack_28->gp_offset = uVar9 + 8;
            }
            else {
              local_228 = (ulong *)p_Stack_28->overflow_arg_area;
              p_Stack_28->overflow_arg_area = local_228 + 1;
            }
            uStack_108 = *local_228;
          }
        }
        else {
          uVar9 = p_Stack_28->gp_offset;
          if (uVar9 < 0x29) {
            local_210 = (ulong *)((long)(int)uVar9 + (long)p_Stack_28->reg_save_area);
            p_Stack_28->gp_offset = uVar9 + 8;
          }
          else {
            local_210 = (ulong *)p_Stack_28->overflow_arg_area;
            p_Stack_28->overflow_arg_area = local_210 + 1;
          }
          uStack_108 = *local_210;
        }
        if ((long)uStack_108 < 0) {
          if (uStack_108 == 0x8000000000000000) {
            local_60 = 0x8000000000000000;
          }
          else {
            local_60 = -uStack_108;
          }
          longvalue._5_1_ = '-';
        }
        else {
          local_60 = uStack_108;
          longvalue._5_1_ = '\0';
        }
      }
      local_4c = 0;
      if (idx < 0x3c) {
        zExtra._4_4_ = 0x46;
        p_Stack_88 = (__va_list_tag *)local_f8;
      }
      else {
        zExtra._4_4_ = idx + 10;
        _e2 = (__va_list_tag *)sqlite3Malloc(zExtra._4_4_);
        p_Stack_88 = _e2;
        if (_e2 == (__va_list_tag *)0x0) {
          pSStack_10->mallocFailed = '\x01';
          return;
        }
      }
      p_Var12 = (__va_list_tag *)((long)&p_Stack_88->gp_offset + (long)(zExtra._4_4_ + -1));
      _length = (char *)p_Var12;
      if (longvalue._6_1_ == '\x10') {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_60;
        cset._4_4_ = SUB164(auVar5 % ZEXT816(10),0);
        if ((3 < cset._4_4_) || ((local_60 / 10) % 10 == 1)) {
          cset._4_4_ = 0;
        }
        _length = (char *)((long)&p_Var12[-1].reg_save_area + 7);
        *(char *)((long)&p_Var12[-1].reg_save_area + 7) = "thstndrd"[(int)(cset._4_4_ * 2 + 1)];
        pcVar1 = _length + -1;
        _length = (char *)(_length + -1);
        *pcVar1 = "thstndrd"[(int)(cset._4_4_ << 1)];
      }
      bVar2 = zOut[4];
      bVar3 = zOut[1];
      do {
        p_Var12 = (__va_list_tag *)((long)_length + -0x18);
        _length = (char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7);
        *(char *)((long)&p_Var12->reg_save_area + 7) =
             "0123456789ABCDEF0123456789abcdef"
             [local_60 % (ulong)(long)(int)(uint)bVar3 + (ulong)bVar2];
        local_60 = local_60 / (ulong)(long)(int)(uint)bVar3;
      } while (local_60 != 0);
      local_60 = 0;
      for (_flag_alternateform = idx - (((int)p_Stack_88 + zExtra._4_4_ + -1) - (int)_length);
          0 < _flag_alternateform; _flag_alternateform = _flag_alternateform + -1) {
        p_Var12 = (__va_list_tag *)((long)_length + -0x18);
        _length = (char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7);
        *(undefined1 *)((long)&p_Var12->reg_save_area + 7) = 0x30;
      }
      if (longvalue._5_1_ != '\0') {
        p_Var12 = (__va_list_tag *)((long)_length + -0x18);
        _length = (char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7);
        *(char *)((long)&p_Var12->reg_save_area + 7) = longvalue._5_1_;
      }
      if ((local_4c != 0) && (zOut[5] != '\0')) {
        for (pcStack_128 = "-x0" + (byte)zOut[5]; *pcStack_128 != '\0';
            pcStack_128 = pcStack_128 + 1) {
          p_Var12 = (__va_list_tag *)((long)_length + -0x18);
          _length = (char *)((long)&((__va_list_tag *)((long)_length + -0x18))->reg_save_area + 7);
          *(char *)((long)&p_Var12->reg_save_area + 7) = *pcStack_128;
        }
      }
      width = ((int)p_Stack_88 + zExtra._4_4_ + -1) - (int)_length;
      break;
    default:
      goto switchD_0012c3df_default;
    }
    if ((done == '\0') && (0 < _flag_longlong - width)) {
      sqlite3AppendSpace(pSStack_10,_flag_longlong - width);
    }
    if (0 < width) {
      sqlite3StrAccumAppend(pSStack_10,_length,width);
    }
    if ((done != '\0') && (0 < _flag_longlong - width)) {
      sqlite3AppendSpace(pSStack_10,_flag_longlong - width);
    }
    sqlite3_free(_e2);
  }
switchD_0012c3df_default:
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VXPrintf(
  StrAccum *pAccum,                  /* Accumulate results here */
  int useExtended,                   /* Allow extended %-conversions */
  const char *fmt,                   /* Format string */
  va_list ap                         /* arguments */
){
  int c;                     /* Next character in the format string */
  char *bufpt;               /* Pointer to the conversion buffer */
  int precision;             /* Precision of the current field */
  int length;                /* Length of the field */
  int idx;                   /* A general purpose loop counter */
  int width;                 /* Width of the current field */
  etByte flag_leftjustify;   /* True if "-" flag is present */
  etByte flag_plussign;      /* True if "+" flag is present */
  etByte flag_blanksign;     /* True if " " flag is present */
  etByte flag_alternateform; /* True if "#" flag is present */
  etByte flag_altform2;      /* True if "!" flag is present */
  etByte flag_zeropad;       /* True if field width constant starts with zero */
  etByte flag_long;          /* True if "l" flag is present */
  etByte flag_longlong;      /* True if the "ll" flag is present */
  etByte done;               /* Loop termination flag */
  etByte xtype = 0;          /* Conversion paradigm */
  char prefix;               /* Prefix character.  "+" or "-" or " " or '\0'. */
  sqlite_uint64 longvalue;   /* Value for integer types */
  LONGDOUBLE_TYPE realvalue; /* Value for real types */
  const et_info *infop;      /* Pointer to the appropriate info structure */
  char *zOut;                /* Rendering buffer */
  int nOut;                  /* Size of the rendering buffer */
  char *zExtra;              /* Malloced memory used by some conversion */
#ifndef SQLITE_OMIT_FLOATING_POINT
  int  exp, e2;              /* exponent of real numbers */
  int nsd;                   /* Number of significant digits returned */
  double rounder;            /* Used for rounding floating point values */
  etByte flag_dp;            /* True if decimal point should be shown */
  etByte flag_rtz;           /* True if trailing zeros should be removed */
#endif
  char buf[etBUFSIZE];       /* Conversion buffer */

  bufpt = 0;
  for(; (c=(*fmt))!=0; ++fmt){
    if( c!='%' ){
      int amt;
      bufpt = (char *)fmt;
      amt = 1;
      while( (c=(*++fmt))!='%' && c!=0 ) amt++;
      sqlite3StrAccumAppend(pAccum, bufpt, amt);
      if( c==0 ) break;
    }
    if( (c=(*++fmt))==0 ){
      sqlite3StrAccumAppend(pAccum, "%", 1);
      break;
    }
    /* Find out what flags are present */
    flag_leftjustify = flag_plussign = flag_blanksign = 
     flag_alternateform = flag_altform2 = flag_zeropad = 0;
    done = 0;
    do{
      switch( c ){
        case '-':   flag_leftjustify = 1;     break;
        case '+':   flag_plussign = 1;        break;
        case ' ':   flag_blanksign = 1;       break;
        case '#':   flag_alternateform = 1;   break;
        case '!':   flag_altform2 = 1;        break;
        case '0':   flag_zeropad = 1;         break;
        default:    done = 1;                 break;
      }
    }while( !done && (c=(*++fmt))!=0 );
    /* Get the field width */
    width = 0;
    if( c=='*' ){
      width = va_arg(ap,int);
      if( width<0 ){
        flag_leftjustify = 1;
        width = -width;
      }
      c = *++fmt;
    }else{
      while( c>='0' && c<='9' ){
        width = width*10 + c - '0';
        c = *++fmt;
      }
    }
    /* Get the precision */
    if( c=='.' ){
      precision = 0;
      c = *++fmt;
      if( c=='*' ){
        precision = va_arg(ap,int);
        if( precision<0 ) precision = -precision;
        c = *++fmt;
      }else{
        while( c>='0' && c<='9' ){
          precision = precision*10 + c - '0';
          c = *++fmt;
        }
      }
    }else{
      precision = -1;
    }
    /* Get the conversion type modifier */
    if( c=='l' ){
      flag_long = 1;
      c = *++fmt;
      if( c=='l' ){
        flag_longlong = 1;
        c = *++fmt;
      }else{
        flag_longlong = 0;
      }
    }else{
      flag_long = flag_longlong = 0;
    }
    /* Fetch the info entry for the field */
    infop = &fmtinfo[0];
    xtype = etINVALID;
    for(idx=0; idx<ArraySize(fmtinfo); idx++){
      if( c==fmtinfo[idx].fmttype ){
        infop = &fmtinfo[idx];
        if( useExtended || (infop->flags & FLAG_INTERN)==0 ){
          xtype = infop->type;
        }else{
          return;
        }
        break;
      }
    }
    zExtra = 0;

    /*
    ** At this point, variables are initialized as follows:
    **
    **   flag_alternateform          TRUE if a '#' is present.
    **   flag_altform2               TRUE if a '!' is present.
    **   flag_plussign               TRUE if a '+' is present.
    **   flag_leftjustify            TRUE if a '-' is present or if the
    **                               field width was negative.
    **   flag_zeropad                TRUE if the width began with 0.
    **   flag_long                   TRUE if the letter 'l' (ell) prefixed
    **                               the conversion character.
    **   flag_longlong               TRUE if the letter 'll' (ell ell) prefixed
    **                               the conversion character.
    **   flag_blanksign              TRUE if a ' ' is present.
    **   width                       The specified field width.  This is
    **                               always non-negative.  Zero is the default.
    **   precision                   The specified precision.  The default
    **                               is -1.
    **   xtype                       The class of the conversion.
    **   infop                       Pointer to the appropriate info struct.
    */
    switch( xtype ){
      case etPOINTER:
        flag_longlong = sizeof(char*)==sizeof(i64);
        flag_long = sizeof(char*)==sizeof(long int);
        /* Fall through into the next case */
      case etORDINAL:
      case etRADIX:
        if( infop->flags & FLAG_SIGNED ){
          i64 v;
          if( flag_longlong ){
            v = va_arg(ap,i64);
          }else if( flag_long ){
            v = va_arg(ap,long int);
          }else{
            v = va_arg(ap,int);
          }
          if( v<0 ){
            if( v==SMALLEST_INT64 ){
              longvalue = ((u64)1)<<63;
            }else{
              longvalue = -v;
            }
            prefix = '-';
          }else{
            longvalue = v;
            if( flag_plussign )        prefix = '+';
            else if( flag_blanksign )  prefix = ' ';
            else                       prefix = 0;
          }
        }else{
          if( flag_longlong ){
            longvalue = va_arg(ap,u64);
          }else if( flag_long ){
            longvalue = va_arg(ap,unsigned long int);
          }else{
            longvalue = va_arg(ap,unsigned int);
          }
          prefix = 0;
        }
        if( longvalue==0 ) flag_alternateform = 0;
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        if( precision<etBUFSIZE-10 ){
          nOut = etBUFSIZE;
          zOut = buf;
        }else{
          nOut = precision + 10;
          zOut = zExtra = sqlite3Malloc( nOut );
          if( zOut==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        bufpt = &zOut[nOut-1];
        if( xtype==etORDINAL ){
          static const char zOrd[] = "thstndrd";
          int x = (int)(longvalue % 10);
          if( x>=4 || (longvalue/10)%10==1 ){
            x = 0;
          }
          *(--bufpt) = zOrd[x*2+1];
          *(--bufpt) = zOrd[x*2];
        }
        {
          register const char *cset;      /* Use registers for speed */
          register int base;
          cset = &aDigits[infop->charset];
          base = infop->base;
          do{                                           /* Convert to ascii */
            *(--bufpt) = cset[longvalue%base];
            longvalue = longvalue/base;
          }while( longvalue>0 );
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        for(idx=precision-length; idx>0; idx--){
          *(--bufpt) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--bufpt) = prefix;               /* Add sign */
        if( flag_alternateform && infop->prefix ){      /* Add "0" or "0x" */
          const char *pre;
          char x;
          pre = &aPrefix[infop->prefix];
          for(; (x=(*pre))!=0; pre++) *(--bufpt) = x;
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        break;
      case etFLOAT:
      case etEXP:
      case etGENERIC:
        realvalue = va_arg(ap,double);
#ifdef SQLITE_OMIT_FLOATING_POINT
        length = 0;
#else
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( xtype==etGENERIC && precision>0 ) precision--;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.  Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1){}
#endif
        if( xtype==etFLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( sqlite3IsNaN((double)realvalue) ){
          bufpt = "NaN";
          length = 3;
          break;
        }
        if( realvalue>0.0 ){
          LONGDOUBLE_TYPE scale = 1.0;
          while( realvalue>=1e100*scale && exp<=350 ){ scale *= 1e100;exp+=100;}
          while( realvalue>=1e64*scale && exp<=350 ){ scale *= 1e64; exp+=64; }
          while( realvalue>=1e8*scale && exp<=350 ){ scale *= 1e8; exp+=8; }
          while( realvalue>=10.0*scale && exp<=350 ){ scale *= 10.0; exp++; }
          realvalue /= scale;
          while( realvalue<1e-8 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 ){ realvalue *= 10.0; exp--; }
          if( exp>350 ){
            if( prefix=='-' ){
              bufpt = "-Inf";
            }else if( prefix=='+' ){
              bufpt = "+Inf";
            }else{
              bufpt = "Inf";
            }
            length = sqlite3Strlen30(bufpt);
            break;
          }
        }
        bufpt = buf;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        if( xtype!=etFLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==etGENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = etEXP;
          }else{
            precision = precision - exp;
            xtype = etFLOAT;
          }
        }else{
          flag_rtz = flag_altform2;
        }
        if( xtype==etEXP ){
          e2 = 0;
        }else{
          e2 = exp;
        }
        if( e2+precision+width > etBUFSIZE - 15 ){
          bufpt = zExtra = sqlite3Malloc( e2+precision+width+15 );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        zOut = bufpt;
        nsd = 16 + flag_altform2*10;
        flag_dp = (precision>0 ?1:0) | flag_alternateform | flag_altform2;
        /* The sign in front of the number */
        if( prefix ){
          *(bufpt++) = prefix;
        }
        /* Digits prior to the decimal point */
        if( e2<0 ){
          *(bufpt++) = '0';
        }else{
          for(; e2>=0; e2--){
            *(bufpt++) = et_getdigit(&realvalue,&nsd);
          }
        }
        /* The decimal point */
        if( flag_dp ){
          *(bufpt++) = '.';
        }
        /* "0" digits after the decimal point but before the first
        ** significant digit of the number */
        for(e2++; e2<0; precision--, e2++){
          assert( precision>0 );
          *(bufpt++) = '0';
        }
        /* Significant digits after the decimal point */
        while( (precision--)>0 ){
          *(bufpt++) = et_getdigit(&realvalue,&nsd);
        }
        /* Remove trailing zeros and the "." if no digits follow the "." */
        if( flag_rtz && flag_dp ){
          while( bufpt[-1]=='0' ) *(--bufpt) = 0;
          assert( bufpt>zOut );
          if( bufpt[-1]=='.' ){
            if( flag_altform2 ){
              *(bufpt++) = '0';
            }else{
              *(--bufpt) = 0;
            }
          }
        }
        /* Add the "eNNN" suffix */
        if( xtype==etEXP ){
          *(bufpt++) = aDigits[infop->charset];
          if( exp<0 ){
            *(bufpt++) = '-'; exp = -exp;
          }else{
            *(bufpt++) = '+';
          }
          if( exp>=100 ){
            *(bufpt++) = (char)((exp/100)+'0');        /* 100's digit */
            exp %= 100;
          }
          *(bufpt++) = (char)(exp/10+'0');             /* 10's digit */
          *(bufpt++) = (char)(exp%10+'0');             /* 1's digit */
        }
        *bufpt = 0;

        /* The converted number is in buf[] and zero terminated. Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions. */
        length = (int)(bufpt-zOut);
        bufpt = zOut;

        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            bufpt[i] = bufpt[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) bufpt[i++] = '0';
          length = width;
        }
#endif /* !defined(SQLITE_OMIT_FLOATING_POINT) */
        break;
      case etSIZE:
        *(va_arg(ap,int*)) = pAccum->nChar;
        length = width = 0;
        break;
      case etPERCENT:
        buf[0] = '%';
        bufpt = buf;
        length = 1;
        break;
      case etCHARX:
        c = va_arg(ap,int);
        buf[0] = (char)c;
        if( precision>=0 ){
          for(idx=1; idx<precision; idx++) buf[idx] = (char)c;
          length = precision;
        }else{
          length =1;
        }
        bufpt = buf;
        break;
      case etSTRING:
      case etDYNSTRING:
        bufpt = va_arg(ap,char*);
        if( bufpt==0 ){
          bufpt = "";
        }else if( xtype==etDYNSTRING ){
          zExtra = bufpt;
        }
        if( precision>=0 ){
          for(length=0; length<precision && bufpt[length]; length++){}
        }else{
          length = sqlite3Strlen30(bufpt);
        }
        break;
      case etSQLESCAPE:
      case etSQLESCAPE2:
      case etSQLESCAPE3: {
        int i, j, k, n, isnull;
        int needQuote;
        char ch;
        char q = ((xtype==etSQLESCAPE3)?'"':'\'');   /* Quote character */
        char *escarg = va_arg(ap,char*);
        isnull = escarg==0;
        if( isnull ) escarg = (xtype==etSQLESCAPE2 ? "NULL" : "(NULL)");
        k = precision;
        for(i=n=0; k!=0 && (ch=escarg[i])!=0; i++, k--){
          if( ch==q )  n++;
        }
        needQuote = !isnull && xtype==etSQLESCAPE2;
        n += i + 1 + needQuote*2;
        if( n>etBUFSIZE ){
          bufpt = zExtra = sqlite3Malloc( n );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }else{
          bufpt = buf;
        }
        j = 0;
        if( needQuote ) bufpt[j++] = q;
        k = i;
        for(i=0; i<k; i++){
          bufpt[j++] = ch = escarg[i];
          if( ch==q ) bufpt[j++] = ch;
        }
        if( needQuote ) bufpt[j++] = q;
        bufpt[j] = 0;
        length = j;
        /* The precision in %q and %Q means how many input characters to
        ** consume, not the length of the output...
        ** if( precision>=0 && precision<length ) length = precision; */
        break;
      }
      case etTOKEN: {
        Token *pToken = va_arg(ap, Token*);
        if( pToken ){
          sqlite3StrAccumAppend(pAccum, (const char*)pToken->z, pToken->n);
        }
        length = width = 0;
        break;
      }
      case etSRCLIST: {
        SrcList *pSrc = va_arg(ap, SrcList*);
        int k = va_arg(ap, int);
        struct SrcList_item *pItem = &pSrc->a[k];
        assert( k>=0 && k<pSrc->nSrc );
        if( pItem->zDatabase ){
          sqlite3StrAccumAppend(pAccum, pItem->zDatabase, -1);
          sqlite3StrAccumAppend(pAccum, ".", 1);
        }
        sqlite3StrAccumAppend(pAccum, pItem->zName, -1);
        length = width = 0;
        break;
      }
      default: {
        assert( xtype==etINVALID );
        return;
      }
    }/* End switch over the format type */
    /*
    ** The text of the conversion is pointed to by "bufpt" and is
    ** "length" characters long.  The field width is "width".  Do
    ** the output.
    */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    if( length>0 ){
      sqlite3StrAccumAppend(pAccum, bufpt, length);
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    sqlite3_free(zExtra);
  }/* End for loop over the format string */
}